

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc_data.cpp
# Opt level: O2

void __thiscall NPC_Data::UnloadShopDrop(NPC_Data *this)

{
  std::
  vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
  ::clear(&this->drops);
  std::
  vector<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
  ::clear(&this->shop_trade);
  std::
  vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
  ::clear(&this->shop_craft);
  std::
  vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
  ::clear(&this->skill_learn);
  this->drops_chance_total = 0.0;
  std::__uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>::reset
            ((__uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_> *)
             &this->citizenship,(pointer)0x0);
  return;
}

Assistant:

void NPC_Data::UnloadShopDrop()
{
	this->drops.clear();
	this->shop_trade.clear();
	this->shop_craft.clear();
	this->skill_learn.clear();

	this->drops_chance_total = 0.0;

	this->citizenship.reset();
}